

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

char * lws_get_peer_simple_fd(lws_sockfd_type fd,char *name,size_t namelen)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *obuf;
  lws_sockaddr46 sa46;
  socklen_t len;
  sockaddr local_24;
  socklen_t local_14;
  
  local_14 = 0x10;
  iVar1 = getpeername(fd,&local_24,&local_14);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    lws_snprintf(name,namelen,"getpeername: %s",pcVar3);
  }
  else {
    *name = '\0';
    if (local_24.sa_family == 2) {
      lws_snprintf(name,namelen,"%u.%u.%u.%u",(ulong)(byte)local_24.sa_data[2],
                   (ulong)(byte)local_24.sa_data[3],(ulong)(byte)local_24.sa_data[4],
                   (uint)(byte)local_24.sa_data[5]);
    }
  }
  return name;
}

Assistant:

const char *
lws_get_peer_simple_fd(lws_sockfd_type fd, char *name, size_t namelen)
{
	lws_sockaddr46 sa46;
	socklen_t len = sizeof(sa46);

	if (getpeername(fd, (struct sockaddr *)&sa46, &len) < 0) {
		lws_snprintf(name, namelen, "getpeername: %s",
				strerror(LWS_ERRNO));
		return name;
	}

	lws_sa46_write_numeric_address(&sa46, name, namelen);

	return name;
}